

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.cpp
# Opt level: O0

int __thiscall ncnn::Squeeze::forward(Squeeze *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  long in_RSI;
  long in_RDI;
  int axis;
  int i;
  int *axes_ptr;
  bool _squeeze_c;
  bool _squeeze_h;
  bool _squeeze_w;
  int dims;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffffc20;
  Mat *in_stack_fffffffffffffc28;
  Mat *this_00;
  Allocator *in_stack_fffffffffffffc58;
  int _h;
  undefined1 *in_stack_fffffffffffffc60;
  int iVar2;
  Mat *in_stack_fffffffffffffc68;
  bool local_383;
  bool local_382;
  bool local_381;
  Mat local_378;
  Mat local_330 [6];
  Allocator local_180 [9];
  undefined1 local_138 [72];
  Mat local_f0 [2];
  int local_50;
  int local_4c;
  int *local_48;
  bool local_3b;
  bool local_3a;
  bool local_39;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RSI + 0x38);
  local_38 = *(int *)(in_RSI + 0x28);
  local_39 = false;
  local_3a = false;
  local_3b = false;
  bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffc20);
  if (bVar1) {
    local_381 = false;
    if (local_2c == 1) {
      local_381 = *(int *)(in_RDI + 0xd0) != 0;
    }
    local_39 = local_381;
    local_382 = false;
    if (local_30 == 1) {
      local_382 = *(int *)(in_RDI + 0xd4) != 0;
    }
    local_3a = local_382;
    local_383 = false;
    if (local_34 == 1) {
      local_383 = *(int *)(in_RDI + 0xd8) != 0;
    }
    local_3b = local_383;
  }
  else {
    local_48 = ncnn::Mat::operator_cast_to_int_((Mat *)(in_RDI + 0xe0));
    for (local_4c = 0; local_4c < *(int *)(in_RDI + 0x10c); local_4c = local_4c + 1) {
      local_50 = local_48[local_4c];
      if (local_50 < 0) {
        local_50 = local_38 + local_50;
      }
      if ((local_38 == 1) && (local_50 == 0)) {
        local_39 = local_2c == 1;
      }
      if ((local_38 == 2) && (local_50 == 0)) {
        local_3a = local_30 == 1;
      }
      if ((local_38 == 2) && (local_50 == 1)) {
        local_39 = local_2c == 1;
      }
      if ((local_38 == 3) && (local_50 == 0)) {
        local_3b = local_34 == 1;
      }
      if ((local_38 == 3) && (local_50 == 1)) {
        local_3a = local_30 == 1;
      }
      if ((local_38 == 3) && (local_50 == 2)) {
        local_39 = local_2c == 1;
      }
    }
  }
  ncnn::Mat::operator=(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  if ((local_38 == 1) && ((local_39 & 1U) != 0)) {
    ncnn::Mat::reshape(in_stack_fffffffffffffc68,(int)((ulong)in_stack_fffffffffffffc60 >> 0x20),
                       in_stack_fffffffffffffc58);
    ncnn::Mat::operator=(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    ncnn::Mat::~Mat((Mat *)0x6a5d56);
  }
  if (local_38 == 2) {
    iVar2 = (int)((ulong)in_stack_fffffffffffffc60 >> 0x20);
    if (((local_39 & 1U) == 0) || ((local_3a & 1U) == 0)) {
      if ((local_39 & 1U) == 0) {
        if ((local_3a & 1U) != 0) {
          in_stack_fffffffffffffc58 = local_180;
          ncnn::Mat::reshape(in_stack_fffffffffffffc68,iVar2,in_stack_fffffffffffffc58);
          ncnn::Mat::operator=(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
          ncnn::Mat::~Mat((Mat *)0x6a5ef8);
        }
      }
      else {
        in_stack_fffffffffffffc60 = local_138;
        ncnn::Mat::reshape(in_stack_fffffffffffffc68,(int)((ulong)in_stack_fffffffffffffc60 >> 0x20)
                           ,in_stack_fffffffffffffc58);
        ncnn::Mat::operator=(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
        ncnn::Mat::~Mat((Mat *)0x6a5e75);
      }
    }
    else {
      in_stack_fffffffffffffc68 = local_f0;
      ncnn::Mat::reshape(in_stack_fffffffffffffc68,iVar2,in_stack_fffffffffffffc58);
      ncnn::Mat::operator=(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
      ncnn::Mat::~Mat((Mat *)0x6a5df2);
    }
  }
  if (local_38 == 3) {
    iVar2 = (int)((ulong)in_stack_fffffffffffffc60 >> 0x20);
    if ((((local_39 & 1U) == 0) || ((local_3a & 1U) == 0)) || ((local_3b & 1U) == 0)) {
      if (((local_39 & 1U) == 0) || ((local_3a & 1U) == 0)) {
        if (((local_3a & 1U) == 0) || ((local_3b & 1U) == 0)) {
          if (((local_39 & 1U) == 0) || ((local_3b & 1U) == 0)) {
            _h = (int)in_stack_fffffffffffffc60;
            if ((local_39 & 1U) == 0) {
              if ((local_3a & 1U) == 0) {
                if ((local_3b & 1U) != 0) {
                  in_stack_fffffffffffffc20 = &local_378;
                  ncnn::Mat::reshape(in_stack_fffffffffffffc68,iVar2,_h,in_stack_fffffffffffffc58);
                  ncnn::Mat::operator=(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
                  ncnn::Mat::~Mat((Mat *)0x6a62f9);
                }
              }
              else {
                this_00 = local_330;
                ncnn::Mat::reshape(in_stack_fffffffffffffc68,iVar2,_h,in_stack_fffffffffffffc58);
                ncnn::Mat::operator=(this_00,in_stack_fffffffffffffc20);
                ncnn::Mat::~Mat((Mat *)0x6a6275);
              }
            }
            else {
              ncnn::Mat::reshape(in_stack_fffffffffffffc68,iVar2,_h,in_stack_fffffffffffffc58);
              ncnn::Mat::operator=(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
              ncnn::Mat::~Mat((Mat *)0x6a61e7);
            }
          }
          else {
            ncnn::Mat::reshape(in_stack_fffffffffffffc68,iVar2,in_stack_fffffffffffffc58);
            ncnn::Mat::operator=(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
            ncnn::Mat::~Mat((Mat *)0x6a6159);
          }
        }
        else {
          ncnn::Mat::reshape(in_stack_fffffffffffffc68,iVar2,in_stack_fffffffffffffc58);
          ncnn::Mat::operator=(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
          ncnn::Mat::~Mat((Mat *)0x6a60c8);
        }
      }
      else {
        ncnn::Mat::reshape(in_stack_fffffffffffffc68,iVar2,in_stack_fffffffffffffc58);
        ncnn::Mat::operator=(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
        ncnn::Mat::~Mat((Mat *)0x6a6037);
      }
    }
    else {
      ncnn::Mat::reshape(in_stack_fffffffffffffc68,iVar2,in_stack_fffffffffffffc58);
      ncnn::Mat::operator=(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
      ncnn::Mat::~Mat((Mat *)0x6a5fa6);
    }
  }
  bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffc20);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Squeeze::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    bool _squeeze_w = false;
    bool _squeeze_h = false;
    bool _squeeze_c = false;

    if (axes.empty())
    {
        _squeeze_w = w == 1 && squeeze_w;
        _squeeze_h = h == 1 && squeeze_h;
        _squeeze_c = channels == 1 && squeeze_c;
    }
    else
    {
        const int* axes_ptr = axes;
        for (int i = 0; i < axes.w; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + axis;

            if (dims == 1 && axis == 0)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 2 && axis == 0)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 2 && axis == 1)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 3 && axis == 0)
            {
                _squeeze_c = channels == 1;
            }
            if (dims == 3 && axis == 1)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 3 && axis == 2)
            {
                _squeeze_w = w == 1;
            }
        }
    }

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
    }

    if (dims == 2)
    {
        if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
    }

    if (dims == 3)
    {
        if (_squeeze_w && _squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, channels, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, channels, opt.blob_allocator);
        }
        else if (_squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, h, opt.blob_allocator);
        }
    }

    if (top_blob.empty())
        return -100;

    return 0;
}